

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

BOOL __thiscall
Js::TypedArray<char,_false,_false>::DirectSetItemAtRange
          (TypedArray<char,_false,_false> *this,int32 start,uint32 length,char typedValue)

{
  bool bVar1;
  BOOL BVar2;
  uint32 uVar3;
  uint32 uVar4;
  ScriptContext *scriptContext;
  uint32 i;
  size_t byteSize;
  char *typedBuffer;
  uint local_28;
  uint32 newLength;
  uint32 newStart;
  char typedValue_local;
  uint32 length_local;
  int32 start_local;
  TypedArray<char,_false,_false> *this_local;
  
  BVar2 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<char,false,false>>(this);
  if (BVar2 == 0) {
    bVar1 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
    if (bVar1) {
      scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    typedBuffer._4_4_ = length;
    local_28 = start;
    if (start < 0) {
      if ((long)((ulong)length + (long)start) < 0) {
        return 1;
      }
      local_28 = 0;
      typedBuffer._4_4_ = start + length;
    }
    uVar3 = ArrayObject::GetLength((ArrayObject *)this);
    if (local_28 < uVar3) {
      uVar3 = UInt32Math::Add(local_28,typedBuffer._4_4_);
      uVar4 = ArrayObject::GetLength((ArrayObject *)this);
      if (uVar4 < uVar3) {
        uVar3 = ArrayObject::GetLength((ArrayObject *)this);
        typedBuffer._4_4_ = uVar3 - local_28;
      }
      memset((this->super_TypedArrayBase).buffer + local_28,(uint)(byte)typedValue,
             (ulong)typedBuffer._4_4_);
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

inline BOOL DirectSetItemAtRange(__in int32 start, __in uint32 length, __in TypeName typedValue)
        {
            if (CrossSite::IsCrossSiteObjectTyped(this))
            {
                return false;
            }

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }
            uint32 newStart = start, newLength = length;

            if (start < 0)
            {
                if ((int64)(length) + start < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }
                newStart = 0;
                // fixup the length with the change
                newLength += start;
            }
            if (newStart >= GetLength())
            {
                // If we want to start copying past the length of the array, all index are no-op
                return true;
            }
            if (UInt32Math::Add(newStart, newLength) > GetLength())
            {
                newLength = GetLength() - newStart;
            }

            TypeName* typedBuffer = (TypeName*)buffer;

            if (typedValue == 0 || sizeof(TypeName) == 1)
            {
                const size_t byteSize = sizeof(TypeName) * newLength;
                Assert(byteSize >= newLength); // check for overflow
                memset(typedBuffer + newStart, (int)typedValue, byteSize);
            }
            else
            {
                for (uint32 i = 0; i < newLength; i++)
                {
                    typedBuffer[newStart + i] = typedValue;
                }
            }

            return TRUE;
        }